

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O3

string * stringformat<std::__cxx11::string>
                   (string *__return_storage_ptr__,char *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  stringstream buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1c8._M_dataplus._M_p = (args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p == paVar1) {
    local_1c8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1c8.field_2._8_8_ = *(undefined8 *)((long)&args->field_2 + 8);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_1c8._M_string_length = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  StringFormatter<std::__cxx11::string>::format<std::__cxx11::string_const>
            (local_198,fmt,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}